

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_bind_parameter_index(sqlite3_stmt *pStmt,char *zName)

{
  uint nName;
  int iVar1;
  size_t sVar2;
  
  if (zName == (char *)0x0) {
    nName = 0;
  }
  else {
    sVar2 = strlen(zName);
    nName = (uint)sVar2 & 0x3fffffff;
  }
  if (pStmt == (sqlite3_stmt *)0x0 || zName == (char *)0x0) {
    return 0;
  }
  iVar1 = sqlite3VListNameToNum(*(VList **)(pStmt + 0xb0),zName,nName);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_parameter_index(sqlite3_stmt *pStmt, const char *zName){
  return sqlite3VdbeParameterIndex((Vdbe*)pStmt, zName, sqlite3Strlen30(zName));
}